

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O3

bool __thiscall
SQVM::StartCall<true>
          (SQVM *this,SQClosure *closure,SQInteger target,SQInteger args,SQInteger stackbase,
          bool tailcall)

{
  long *plVar1;
  SQObjectType *pSVar2;
  undefined8 *puVar3;
  undefined4 *puVar4;
  undefined4 *puVar5;
  SQUnsignedInteger *pSVar6;
  SQObjectType SVar7;
  uint uVar8;
  SQFunctionProto *pSVar9;
  long lVar10;
  SQSharedState *pSVar11;
  SQObjectPtr *pSVar12;
  SQTable *pSVar13;
  SQObjectPtr *pSVar14;
  long *plVar15;
  SQWeakRef *pSVar16;
  CallInfo *pCVar17;
  SQObjectType SVar18;
  SQFloat SVar19;
  SQObjectType SVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  SQObjectFlags SVar23;
  undefined3 uVar24;
  bool bVar25;
  SQArray *this_00;
  SQGenerator *this_01;
  char *pcVar26;
  char *pcVar27;
  ulong uVar28;
  long lVar29;
  long lVar30;
  char *s;
  undefined4 uVar31;
  long lVar32;
  ulong uVar33;
  ulong uVar34;
  long lVar35;
  SQObjectPtr temp;
  SQObject local_48;
  
  pSVar9 = closure->_function;
  lVar35 = pSVar9->_nparameters;
  lVar10 = pSVar9->_stacksize;
  if (pSVar9->_varparams == 0) {
    if (lVar35 != args) {
      lVar29 = pSVar9->_ndefaultparams;
      lVar30 = lVar35 - args;
      if (((lVar30 == 0 || lVar35 < args) || lVar29 == 0) ||
         (lVar32 = lVar29 - lVar30, lVar29 < lVar30)) {
        pcVar26 = "unknown";
        pcVar27 = "unknown";
        if ((pSVar9->_name).super_SQObject._type == OT_STRING) {
          pcVar27 = (char *)&((pSVar9->_name).super_SQObject._unVal.pTable)->_firstfree;
        }
        if ((pSVar9->_sourcename).super_SQObject._type == OT_STRING) {
          pcVar26 = (char *)&((pSVar9->_sourcename).super_SQObject._unVal.pTable)->_firstfree;
        }
        if (pSVar9->_nlineinfos < 1) {
          uVar34 = 0;
        }
        else {
          uVar34 = (ulong)(*(uint *)&pSVar9->_lineinfos->field_0x4 & 0x7fffffff);
        }
        uVar31 = (undefined4)lVar35;
        s = "wrong number of parameters passed to \'%s\' %s:%d (%d passed, %d required)";
        goto LAB_00143bb5;
      }
      if (0 < lVar30) {
        lVar35 = args * 0x10 + stackbase * 0x10;
        lVar30 = lVar32 * 0x10;
        do {
          pSVar14 = (this->_stack)._vals;
          uVar8 = *(uint *)((long)&(pSVar14->super_SQObject)._type + lVar35);
          plVar15 = *(long **)((long)&(pSVar14->super_SQObject)._unVal + lVar35);
          puVar4 = (undefined4 *)((long)&(closure->_defaultparams->super_SQObject)._type + lVar30);
          uVar31 = puVar4[1];
          uVar21 = puVar4[2];
          uVar22 = puVar4[3];
          puVar5 = (undefined4 *)((long)&(pSVar14->super_SQObject)._type + lVar35);
          *puVar5 = *puVar4;
          puVar5[1] = uVar31;
          puVar5[2] = uVar21;
          puVar5[3] = uVar22;
          if ((*(byte *)((long)&(pSVar14->super_SQObject)._type + lVar35 + 3) & 8) != 0) {
            plVar1 = (long *)(*(long *)((long)&(pSVar14->super_SQObject)._unVal + lVar35) + 8);
            *plVar1 = *plVar1 + 1;
          }
          if ((uVar8 >> 0x1b & 1) != 0) {
            plVar1 = plVar15 + 1;
            *plVar1 = *plVar1 + -1;
            if (*plVar1 == 0) {
              (**(code **)(*plVar15 + 0x10))();
            }
          }
          lVar32 = lVar32 + 1;
          lVar35 = lVar35 + 0x10;
          lVar30 = lVar30 + 0x10;
        } while (lVar32 < lVar29);
      }
    }
  }
  else {
    lVar29 = lVar35 + -1;
    uVar34 = args - lVar29;
    if (args < lVar29) {
      pcVar26 = "unknown";
      pcVar27 = "unknown";
      if ((pSVar9->_name).super_SQObject._type == OT_STRING) {
        pcVar27 = (char *)&((pSVar9->_name).super_SQObject._unVal.pTable)->_firstfree;
      }
      if ((pSVar9->_sourcename).super_SQObject._type == OT_STRING) {
        pcVar26 = (char *)&((pSVar9->_sourcename).super_SQObject._unVal.pTable)->_firstfree;
      }
      if (pSVar9->_nlineinfos < 1) {
        uVar34 = 0;
      }
      else {
        uVar34 = (ulong)(*(uint *)&pSVar9->_lineinfos->field_0x4 & 0x7fffffff);
      }
      uVar31 = (undefined4)lVar29;
      s = "wrong number of parameters passed to \'%s\' %s:%d (%d passed, at least %d required)";
LAB_00143bb5:
      Raise_Error(this,s,pcVar27,pcVar26,uVar34,args & 0xffffffff,uVar31);
      return false;
    }
    pSVar11 = this->_sharedstate;
    this_00 = (SQArray *)sq_vm_malloc(pSVar11->_alloc_ctx,0x48);
    SQArray::SQArray(this_00,pSVar11,uVar34);
    lVar29 = lVar29 + stackbase;
    if (0 < (long)uVar34) {
      lVar30 = lVar29 * 0x10;
      lVar35 = (lVar35 + stackbase) * 0x10 + -8;
      uVar33 = 0;
      do {
        pSVar12 = (this_00->_values)._vals;
        uVar28 = uVar33 & 0xffffffff;
        SVar7 = pSVar12[uVar28].super_SQObject._type;
        pSVar13 = pSVar12[uVar28].super_SQObject._unVal.pTable;
        pSVar2 = (SQObjectType *)((long)&(((this->_stack)._vals)->super_SQObject)._type + lVar30);
        SVar18 = pSVar2[1];
        SVar19 = (SQFloat)pSVar2[2];
        SVar20 = pSVar2[3];
        pSVar14 = pSVar12 + uVar28;
        (pSVar14->super_SQObject)._type = *pSVar2;
        *(SQObjectType *)&(pSVar14->super_SQObject)._flags = SVar18;
        (pSVar14->super_SQObject)._unVal.fFloat = SVar19;
        *(SQObjectType *)((long)&(pSVar14->super_SQObject)._unVal + 4) = SVar20;
        if ((pSVar12[uVar28].super_SQObject._type & 0x8000000) != 0) {
          pSVar6 = &((pSVar12[uVar28].super_SQObject._unVal.pTable)->super_SQDelegable).
                    super_SQCollectable.super_SQRefCounted._uiRef;
          *pSVar6 = *pSVar6 + 1;
        }
        if ((SVar7 >> 0x1b & 1) != 0) {
          pSVar6 = &(pSVar13->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
          *pSVar6 = *pSVar6 - 1;
          if (*pSVar6 == 0) {
            (*(pSVar13->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted
              [2])();
          }
        }
        pSVar14 = (this->_stack)._vals;
        plVar15 = *(long **)((long)&(pSVar14->super_SQObject)._type + lVar35);
        uVar8 = *(uint *)((long)&(pSVar14->super_SQObject)._type + lVar30);
        puVar3 = (undefined8 *)((long)&(pSVar14->super_SQObject)._type + lVar30);
        *puVar3 = 0;
        puVar3[1] = 0;
        *(undefined4 *)((long)&(pSVar14->super_SQObject)._type + lVar30) = 0x1000001;
        if ((uVar8 >> 0x1b & 1) != 0) {
          plVar1 = plVar15 + 1;
          *plVar1 = *plVar1 + -1;
          if (*plVar1 == 0) {
            (**(code **)(*plVar15 + 0x10))();
          }
        }
        uVar33 = uVar33 + 1;
        lVar30 = lVar30 + 0x10;
        lVar35 = lVar35 + 0x10;
      } while (uVar34 != uVar33);
    }
    pSVar14 = (this->_stack)._vals;
    pSVar13 = pSVar14[lVar29].super_SQObject._unVal.pTable;
    SVar7 = pSVar14[lVar29].super_SQObject._type;
    pSVar14[lVar29].super_SQObject._type = OT_ARRAY;
    pSVar14[lVar29].super_SQObject._flags = '\0';
    pSVar14[lVar29].super_SQObject._unVal.pArray = this_00;
    pSVar6 = &(this_00->super_SQCollectable).super_SQRefCounted._uiRef;
    *pSVar6 = *pSVar6 + 1;
    if ((SVar7 >> 0x1b & 1) != 0) {
      pSVar6 = &(pSVar13->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar6 = *pSVar6 - 1;
      if (*pSVar6 == 0) {
        (*(pSVar13->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])
                  ();
      }
    }
  }
  pSVar16 = closure->_env;
  if (pSVar16 != (SQWeakRef *)0x0) {
    pSVar12 = (this->_stack)._vals;
    SVar7 = pSVar12[stackbase].super_SQObject._type;
    pSVar13 = pSVar12[stackbase].super_SQObject._unVal.pTable;
    SVar23 = (pSVar16->_obj)._flags;
    uVar24 = *(undefined3 *)&(pSVar16->_obj).field_0x5;
    SVar19 = (pSVar16->_obj)._unVal.fFloat;
    uVar31 = *(undefined4 *)((long)&(pSVar16->_obj)._unVal + 4);
    pSVar14 = pSVar12 + stackbase;
    (pSVar14->super_SQObject)._type = (pSVar16->_obj)._type;
    (pSVar14->super_SQObject)._flags = SVar23;
    *(undefined3 *)&(pSVar14->super_SQObject).field_0x5 = uVar24;
    (pSVar14->super_SQObject)._unVal.fFloat = SVar19;
    *(undefined4 *)((long)&(pSVar14->super_SQObject)._unVal + 4) = uVar31;
    if ((pSVar12[stackbase].super_SQObject._type & 0x8000000) != 0) {
      pSVar6 = &((pSVar12[stackbase].super_SQObject._unVal.pTable)->super_SQDelegable).
                super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar6 = *pSVar6 + 1;
    }
    if ((SVar7 >> 0x1b & 1) != 0) {
      pSVar6 = &(pSVar13->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar6 = *pSVar6 - 1;
      if (*pSVar6 == 0) {
        (*(pSVar13->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])
                  ();
      }
    }
  }
  bVar25 = EnterFrame(this,stackbase,lVar10 + stackbase,tailcall);
  if (bVar25) {
    pCVar17 = this->ci;
    pSVar13 = (pCVar17->_closure).super_SQObject._unVal.pTable;
    SVar7 = (pCVar17->_closure).super_SQObject._type;
    (pCVar17->_closure).super_SQObject._type = OT_CLOSURE;
    (pCVar17->_closure).super_SQObject._flags = '\0';
    (pCVar17->_closure).super_SQObject._unVal.pClosure = closure;
    pSVar6 = &(closure->super_SQCollectable).super_SQRefCounted._uiRef;
    *pSVar6 = *pSVar6 + 1;
    if ((SVar7 >> 0x1b & 1) != 0) {
      pSVar6 = &(pSVar13->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar6 = *pSVar6 - 1;
      if (*pSVar6 == 0) {
        (*(pSVar13->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])
                  ();
      }
    }
    pCVar17 = this->ci;
    pCVar17->_literals = pSVar9->_literals;
    pCVar17->_ip = pSVar9->_instructions;
    pCVar17->_target = (SQInt32)target;
    if (this->_debughook == true) {
      CallDebugHook(this,99,0);
    }
    pSVar9 = closure->_function;
    if (pSVar9->_bgenerator != true) {
      return true;
    }
    pSVar11 = this->_sharedstate;
    this_01 = (SQGenerator *)sq_vm_malloc(pSVar11->_alloc_ctx,0xc0);
    SQGenerator::SQGenerator(this_01,pSVar11,closure);
    bVar25 = SQGenerator::Yield(this_01,this,pSVar9->_stacksize);
    if (bVar25) {
      local_48._unVal.pTable = (SQTable *)0x0;
      local_48._type = OT_NULL;
      local_48._flags = '\0';
      local_48._5_3_ = 0;
      Return<true>(this,1,target,(SQObjectPtr *)&local_48);
      lVar35 = this->_stackbase;
      pSVar14 = (this->_stack)._vals;
      pSVar13 = pSVar14[lVar35 + target].super_SQObject._unVal.pTable;
      SVar7 = pSVar14[lVar35 + target].super_SQObject._type;
      pSVar14[lVar35 + target].super_SQObject._type = OT_GENERATOR;
      pSVar14[lVar35 + target].super_SQObject._flags = '\0';
      pSVar14[lVar35 + target].super_SQObject._unVal.pGenerator = this_01;
      pSVar6 = &(this_01->super_SQCollectable).super_SQRefCounted._uiRef;
      *pSVar6 = *pSVar6 + 1;
      if ((SVar7 >> 0x1b & 1) != 0) {
        pSVar6 = &(pSVar13->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
        *pSVar6 = *pSVar6 - 1;
        if (*pSVar6 == 0) {
          (*(pSVar13->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted
            [2])();
        }
      }
      SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&local_48);
      return true;
    }
  }
  return false;
}

Assistant:

bool SQVM::StartCall(SQClosure *closure,SQInteger target,SQInteger args,SQInteger stackbase,bool tailcall)
{
    SQFunctionProto *func = closure->_function;

    SQInteger paramssize = func->_nparameters;
    const SQInteger newtop = stackbase + func->_stacksize;
    SQInteger nargs = args;
    if(func->_varparams)
    {
        paramssize--;
        if (nargs < paramssize) {
            Raise_Error(_SC("wrong number of parameters passed to '%s' %s:%d (%d passed, at least %d required)"),
              sq_type(func->_name) == OT_STRING ? _stringval(func->_name) : _SC("unknown"),
              sq_type(func->_sourcename) == OT_STRING ? _stringval(func->_sourcename) : _SC("unknown"),
              int(func->_nlineinfos > 0 ? func->_lineinfos[0]._line : 0),
              (int)nargs, (int)paramssize);
            return false;
        }

        //dumpstack(stackbase);
        SQInteger nvargs = nargs - paramssize;
        SQArray *arr = SQArray::Create(_ss(this),nvargs);
        SQInteger pbase = stackbase+paramssize;
        for(SQInteger n = 0; n < nvargs; n++) {
            arr->_values[n] = _stack._vals[pbase];
            _stack._vals[pbase].Null();
            pbase++;

        }
        _stack._vals[stackbase+paramssize] = arr;
        //dumpstack(stackbase);
    }
    else if (paramssize != nargs) {
        SQInteger ndef = func->_ndefaultparams;
        SQInteger diff;
        if(ndef && nargs < paramssize && (diff = paramssize - nargs) <= ndef) {
            for(SQInteger n = ndef - diff; n < ndef; n++) {
                _stack._vals[stackbase + (nargs++)] = closure->_defaultparams[n];
            }
        }
        else {
            Raise_Error(_SC("wrong number of parameters passed to '%s' %s:%d (%d passed, %d required)"),
              sq_type(func->_name) == OT_STRING ? _stringval(func->_name) : _SC("unknown"),
              sq_type(func->_sourcename) == OT_STRING ? _stringval(func->_sourcename) : _SC("unknown"),
              int(func->_nlineinfos > 0 ? func->_lineinfos[0]._line : 0),
              (int)nargs, (int)paramssize);
            return false;
        }
    }

    if(closure->_env) {
        _stack._vals[stackbase] = closure->_env->_obj;
    }

    if(!EnterFrame(stackbase, newtop, tailcall)) return false;

    ci->_closure  = closure;
    ci->_literals = func->_literals;
    ci->_ip       = func->_instructions;
    ci->_target   = (SQInt32)target;
    if constexpr (debughookPresent)
    {
        if (_debughook) {
            CallDebugHook(_SC('c'));
        }
    }

    if (closure->_function->_bgenerator) {
        SQFunctionProto *f = closure->_function;
        SQGenerator *gen = SQGenerator::Create(_ss(this), closure);
        if(!gen->Yield(this,f->_stacksize))
            return false;
        SQObjectPtr temp;
        Return<debughookPresent>(1, target, temp);
        STK(target) = gen;
    }


    return true;
}